

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_store_dc_pred(MACROBLOCKD *xd,uint8_t *input,CFL_PRED_TYPE pred_plane,int width)

{
  int iVar1;
  int in_ECX;
  byte in_DL;
  void *in_RSI;
  MACROBLOCKD *in_RDI;
  uint16_t *input_16;
  
  iVar1 = is_cur_buf_hbd(in_RDI);
  if (iVar1 == 0) {
    memcpy((in_RDI->cfl).dc_pred_cache + in_DL,in_RSI,(long)in_ECX);
  }
  else {
    memcpy((in_RDI->cfl).dc_pred_cache + in_DL,(void *)((long)in_RSI << 1),(long)(in_ECX << 1));
  }
  return;
}

Assistant:

void cfl_store_dc_pred(MACROBLOCKD *const xd, const uint8_t *input,
                       CFL_PRED_TYPE pred_plane, int width) {
  assert(pred_plane < CFL_PRED_PLANES);
  assert(width <= CFL_BUF_LINE);

  if (is_cur_buf_hbd(xd)) {
    uint16_t *const input_16 = CONVERT_TO_SHORTPTR(input);
    memcpy(xd->cfl.dc_pred_cache[pred_plane], input_16, width << 1);
    return;
  }

  memcpy(xd->cfl.dc_pred_cache[pred_plane], input, width);
}